

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall
QMetaCallEvent::QMetaCallEvent
          (QMetaCallEvent *this,QSlotObjectBase *slotO,QObject *sender,int signalId,int nargs)

{
  QAbstractMetaCallEvent::QAbstractMetaCallEvent
            (&this->super_QAbstractMetaCallEvent,sender,signalId,(QSemaphore *)0x0);
  (this->super_QAbstractMetaCallEvent).super_QEvent._vptr_QEvent =
       (_func_int **)&PTR__QMetaCallEvent_00665b30;
  (this->d).slotObj_._M_t.
  super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
  super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
  super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl = slotO;
  (this->d).args_ = (void **)0x0;
  (this->d).callFunction_ = (StaticMetaCallFunction)0x0;
  (this->d).nargs_ = nargs;
  (this->d).method_offset_ = 0;
  (this->d).method_relative_ = 0xffff;
  this->prealloc_[0] = '\0';
  this->prealloc_[1] = '\0';
  this->prealloc_[2] = '\0';
  this->prealloc_[3] = '\0';
  this->prealloc_[4] = '\0';
  this->prealloc_[5] = '\0';
  this->prealloc_[6] = '\0';
  this->prealloc_[7] = '\0';
  this->prealloc_[8] = '\0';
  this->prealloc_[9] = '\0';
  this->prealloc_[10] = '\0';
  this->prealloc_[0xb] = '\0';
  this->prealloc_[0xc] = '\0';
  this->prealloc_[0xd] = '\0';
  this->prealloc_[0xe] = '\0';
  this->prealloc_[0xf] = '\0';
  this->prealloc_[0x10] = '\0';
  this->prealloc_[0x11] = '\0';
  this->prealloc_[0x12] = '\0';
  this->prealloc_[0x13] = '\0';
  this->prealloc_[0x14] = '\0';
  this->prealloc_[0x15] = '\0';
  this->prealloc_[0x16] = '\0';
  this->prealloc_[0x17] = '\0';
  this->prealloc_[0x18] = '\0';
  this->prealloc_[0x19] = '\0';
  this->prealloc_[0x1a] = '\0';
  this->prealloc_[0x1b] = '\0';
  this->prealloc_[0x1c] = '\0';
  this->prealloc_[0x1d] = '\0';
  this->prealloc_[0x1e] = '\0';
  this->prealloc_[0x1f] = '\0';
  this->prealloc_[0x20] = '\0';
  this->prealloc_[0x21] = '\0';
  this->prealloc_[0x22] = '\0';
  this->prealloc_[0x23] = '\0';
  this->prealloc_[0x24] = '\0';
  this->prealloc_[0x25] = '\0';
  this->prealloc_[0x26] = '\0';
  this->prealloc_[0x27] = '\0';
  this->prealloc_[0x28] = '\0';
  this->prealloc_[0x29] = '\0';
  this->prealloc_[0x2a] = '\0';
  this->prealloc_[0x2b] = '\0';
  this->prealloc_[0x2c] = '\0';
  this->prealloc_[0x2d] = '\0';
  this->prealloc_[0x2e] = '\0';
  this->prealloc_[0x2f] = '\0';
  if (slotO != (QSlotObjectBase *)0x0) {
    LOCK();
    (slotO->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (slotO->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  allocArgs(this);
  return;
}

Assistant:

QMetaCallEvent::QMetaCallEvent(QtPrivate::QSlotObjectBase *slotO,
                               const QObject *sender, int signalId,
                               int nargs)
    : QAbstractMetaCallEvent(sender, signalId),
      d({QtPrivate::SlotObjUniquePtr(slotO), nullptr, nullptr, nargs, 0, ushort(-1)}),
      prealloc_()
{
    if (d.slotObj_)
        d.slotObj_->ref();
    allocArgs();
}